

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  uint len;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  _xmlCatalogEntry *p_Var9;
  _xmlCatalogEntry *catal_00;
  xmlCatalogEntryPtr catal_01;
  _xmlCatalogEntry *catal_02;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  _xmlCatalogEntry *local_1d8;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar2 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar2 == 0) {
      pxVar6 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs == 0) {
        pxVar7 = xmlCatalogListXMLResolve(catal,pxVar6,(xmlChar *)0x0);
        if (pxVar6 == (xmlChar *)0x0) {
          return pxVar7;
        }
      }
      else {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        if (pxVar6 == (xmlChar *)0x0) {
          (*p_Var1)(*ppvVar5,"URN ID %s expanded to NULL\n",URI);
          return (xmlChar *)0x0;
        }
        (*p_Var1)(*ppvVar5,"URN ID expanded to %s\n",pxVar6);
        pxVar7 = xmlCatalogListXMLResolve(catal,pxVar6,(xmlChar *)0x0);
      }
      (*xmlFree)(pxVar6);
      return pxVar7;
    }
    do {
      if (catal->type == XML_CATA_CATALOG) {
        catal_00 = catal->children;
        if (catal_00 == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
          catal_00 = catal->children;
          if (catal_00 == (_xmlCatalogEntry *)0x0) goto LAB_0013ac98;
        }
        if (catal_00->depth < 0x33) {
          uVar12 = 0;
          local_1d8 = (_xmlCatalogEntry *)0x0;
          iVar2 = 0;
          iVar11 = 0;
          p_Var9 = catal_00;
          do {
            switch(p_Var9->type) {
            case XML_CATA_NEXT_CATALOG:
              iVar2 = iVar2 + 1;
              break;
            case XML_CATA_URI:
              iVar3 = xmlStrEqual(URI,p_Var9->name);
              if (iVar3 != 0) {
                if (xmlDebugCatalogs != 0) {
                  pp_Var4 = __xmlGenericError();
                  p_Var1 = *pp_Var4;
                  ppvVar5 = __xmlGenericErrorContext();
                  (*p_Var1)(*ppvVar5,"Found URI match %s\n",p_Var9->name);
                }
                pxVar6 = xmlStrdup(p_Var9->URL);
                goto LAB_0013ac93;
              }
              break;
            case XML_CATA_REWRITE_URI:
              len = xmlStrlen(p_Var9->name);
              if (((int)uVar12 < (int)len) && (iVar3 = xmlStrncmp(URI,p_Var9->name,len), iVar3 == 0)
                 ) {
                local_1d8 = p_Var9;
                uVar12 = len;
              }
              break;
            case XML_CATA_DELEGATE_URI:
              pxVar6 = p_Var9->name;
              iVar3 = xmlStrlen(pxVar6);
              iVar3 = xmlStrncmp(URI,pxVar6,iVar3);
              iVar11 = iVar11 + (uint)(iVar3 == 0);
            }
            p_Var9 = p_Var9->next;
          } while (p_Var9 != (_xmlCatalogEntry *)0x0);
          if (local_1d8 == (_xmlCatalogEntry *)0x0) {
            if (iVar11 != 0) {
              uVar12 = 0;
              goto LAB_0013ad42;
            }
            if (iVar2 != 0) {
              do {
                if (catal_00->type == XML_CATA_NEXT_CATALOG) {
                  catal_01 = catal_00->children;
                  if (catal_01 == (xmlCatalogEntryPtr)0x0) {
                    xmlFetchXMLCatalogFile(catal_00);
                    catal_01 = catal_00->children;
                    if (catal_01 == (xmlCatalogEntryPtr)0x0) goto LAB_0013ac50;
                  }
                  pxVar6 = xmlCatalogListXMLResolveURI(catal_01,URI);
                  if (pxVar6 != (xmlChar *)0x0) {
                    return pxVar6;
                  }
                }
LAB_0013ac50:
                catal_00 = catal_00->next;
              } while (catal_00 != (_xmlCatalogEntry *)0x0);
            }
          }
          else {
            if (xmlDebugCatalogs != 0) {
              pp_Var4 = __xmlGenericError();
              p_Var1 = *pp_Var4;
              ppvVar5 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar5,"Using rewriting rule %s\n",local_1d8->name);
            }
            pxVar6 = xmlStrdup(local_1d8->URL);
            if (pxVar6 != (xmlChar *)0x0) {
              pxVar6 = xmlStrcat(pxVar6,URI + uVar12);
LAB_0013ac93:
              if (pxVar6 != (xmlChar *)0x0) {
                return pxVar6;
              }
            }
          }
        }
        else {
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,catal_00,
                          (void *)0x0,0x14,0x676,XML_ERR_ERROR,(char *)0x0,0,(char *)catal_00->name,
                          (char *)0x0,(char *)0x0,0,0,"Detected recursion in catalog %s\n",
                          catal_00->name,0,0);
        }
      }
LAB_0013ac98:
      catal = catal->next;
    } while (catal != (_xmlCatalogEntry *)0x0);
  }
  return (xmlChar *)0x0;
LAB_0013ad42:
  p_Var9 = catal_00;
  while ((p_Var9->type == XML_CATA_DELEGATE_URI || (p_Var9->type == XML_CATA_DELEGATE_SYSTEM))) {
    pxVar6 = p_Var9->name;
    iVar2 = xmlStrlen(pxVar6);
    iVar2 = xmlStrncmp(URI,pxVar6,iVar2);
    if (iVar2 != 0) break;
    if ((int)uVar12 < 1) goto LAB_0013adba;
    uVar10 = 0;
    while (iVar2 = xmlStrEqual(p_Var9->URL,(xmlChar *)auStack_1c8[uVar10]), iVar2 == 0) {
      uVar10 = uVar10 + 1;
      if (uVar12 == uVar10) {
        catal_00 = p_Var9;
        if (0x31 < (int)uVar12) goto LAB_0013adcc;
        goto LAB_0013adba;
      }
    }
    p_Var9 = p_Var9->next;
    if (p_Var9 == (_xmlCatalogEntry *)0x0) {
      return (xmlChar *)0xffffffffffffffff;
    }
  }
  goto LAB_0013ae25;
LAB_0013adba:
  lVar8 = (long)(int)uVar12;
  uVar12 = uVar12 + 1;
  auStack_1c8[lVar8] = catal_00->URL;
LAB_0013adcc:
  catal_02 = catal_00->children;
  p_Var9 = catal_00;
  if (catal_02 == (_xmlCatalogEntry *)0x0) {
    xmlFetchXMLCatalogFile(catal_00);
    catal_02 = catal_00->children;
    if (catal_02 == (_xmlCatalogEntry *)0x0) goto LAB_0013ae25;
  }
  if (xmlDebugCatalogs != 0) {
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"Trying URI delegate %s\n",catal_00->URL);
    catal_02 = catal_00->children;
  }
  pxVar6 = xmlCatalogListXMLResolveURI(catal_02,URI);
  if (pxVar6 != (xmlChar *)0x0) {
    return pxVar6;
  }
LAB_0013ae25:
  catal_00 = p_Var9->next;
  if (catal_00 == (_xmlCatalogEntry *)0x0) {
    return (xmlChar *)0xffffffffffffffff;
  }
  goto LAB_0013ad42;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}